

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall winmd::reader::ParamSig::ParamSig(ParamSig *this,table_base *table,byte_view *data)

{
  bool bVar1;
  
  parse_cmods(&this->m_cmod,table,data);
  bVar1 = is_by_ref(data);
  this->m_byref = bVar1;
  TypeSig::TypeSig(&this->m_type,table,data);
  return;
}

Assistant:

ParamSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
            , m_type(table, data)
        {
        }